

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

void __thiscall llvm::DWARFVerifier::verifyDebugLineStmtOffsets(DWARFVerifier *this)

{
  undefined8 *puVar1;
  uint uVar2;
  DWARFContext *this_00;
  DWARFUnit *this_01;
  _Base_ptr p_Var3;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  *pmVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar5;
  DIDumpOptions *pDVar6;
  LineTable *pLVar7;
  long lVar8;
  mapped_type *pmVar9;
  raw_ostream *prVar10;
  char *pcVar11;
  DIDumpOptions *pDVar12;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  *pmVar13;
  void *__buf;
  void *__buf_00;
  undefined1 in_R8B;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  *pmVar14;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  *pmVar15;
  size_t *this_02;
  undefined8 *puVar16;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  Optional<unsigned_long> OVar17;
  undefined1 local_e0 [8];
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  StmtListToDie;
  anon_union_48_2_fc7899a5_for_OptionalStorage<llvm::DWARFFormValue,_true>_2 local_98;
  char local_68;
  undefined1 auStack_60 [8];
  DWARFDie Die;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  uint64_t LineTableOffset;
  
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&StmtListToDie;
  StmtListToDie._M_t._M_impl._0_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  this_00 = this->DCtx;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  LineTableOffset = (uint64_t)this;
  DWARFContext::parseNormalUnits(this_00);
  uVar2 = (this_00->NormalUnits).NumInfoUnits;
  if (uVar2 == 0xffffffff) {
    uVar2 = (this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar2 != 0) {
    puVar16 = (undefined8 *)
              (this_00->NormalUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.BeginX;
    puVar1 = puVar16 + uVar2;
    pDVar6 = (DIDumpOptions *)(LineTableOffset + 0x10);
    Die.Die = (DWARFDebugInfoEntry *)&PTR_home_01077fc8;
    do {
      this_01 = (DWARFUnit *)*puVar16;
      DWARFUnit::extractDIEsIfNeeded(this_01,true);
      Die.U = (DWARFUnit *)
              (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
      auStack_60 = (undefined1  [8])this_01;
      if (Die.U == (DWARFUnit *)
                   (this_01->DieArray).
                   super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        Die.U = (DWARFUnit *)0x0;
        auStack_60 = (undefined1  [8])(DWARFUnit *)0x0;
      }
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_98.value,(DWARFDie *)auStack_60,
                     DW_AT_stmt_list);
      if (local_68 != '\0') {
        OVar17 = DWARFFormValue::getAsSectionOffset(&local_98.value);
        if (((undefined1  [16])OVar17.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_40.value = OVar17.Storage.field_0.value;
          pLVar7 = DWARFContext::getLineTableForUnit
                             (*(DWARFContext **)(LineTableOffset + 8),(DWARFUnit *)*puVar16);
          aVar5 = local_40;
          lVar8 = (**(code **)(**(long **)(*(long *)(LineTableOffset + 8) + 0x178) + 0x78))();
          if ((ulong)aVar5 < *(_Base_ptr *)(lVar8 + 8)) {
            if (pLVar7 == (LineTable *)0x0) {
              *(int *)(LineTableOffset + 0x58) = *(int *)(LineTableOffset + 0x58) + 1;
              prVar10 = WithColor::error(*(WithColor **)LineTableOffset,(raw_ostream *)0xe67796,
                                         (StringRef)ZEXT816(0),(bool)in_R8B);
              Str.Length = 0xc;
              Str.Data = ".debug_line[";
              prVar10 = raw_ostream::operator<<(prVar10,Str);
              local_98.value.Value.field_0 =
                   (anon_union_8_3_82d75f4a_for_ValueType_0)((long)"String: 0x%08lx" + 8);
              local_98._0_8_ = Die.Die;
              local_98.value.Value.data = (uint8_t *)local_40;
              prVar10 = raw_ostream::operator<<(prVar10,(format_object_base *)&local_98.value);
              Str_00.Length = 0x24;
              Str_00.Data = "] was not able to be parsed for CU:\n";
              raw_ostream::operator<<(prVar10,Str_00);
              pDVar12 = pDVar6;
              DWARFDie::dump((DWARFDie *)auStack_60,*(raw_ostream **)LineTableOffset,0,*pDVar6);
              prVar10 = *(raw_ostream **)LineTableOffset;
              pcVar11 = prVar10->OutBufCur;
              if (pcVar11 < prVar10->OutBufEnd) {
LAB_00d80634:
                prVar10->OutBufCur = pcVar11 + 1;
                *pcVar11 = '\n';
              }
              else {
                raw_ostream::write(prVar10,10,__buf,(size_t)pDVar12);
              }
            }
            else {
              if (StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
                pmVar4 = (map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                          *)StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                pmVar15 = &StmtListToDie;
                do {
                  pmVar14 = pmVar15;
                  pmVar13 = pmVar4;
                  p_Var3 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
                  pmVar15 = pmVar13;
                  if (p_Var3 < local_40.value) {
                    pmVar15 = pmVar14;
                  }
                  pmVar4 = (map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                            *)(&(pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                              [p_Var3 < local_40.value];
                } while (pmVar4 != (map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                                    *)0x0);
                if (pmVar15 != &StmtListToDie) {
                  if (p_Var3 < local_40.value) {
                    pmVar13 = pmVar14;
                  }
                  if ((pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right <=
                      local_40.value) {
                    *(int *)(LineTableOffset + 0x58) = *(int *)(LineTableOffset + 0x58) + 1;
                    prVar10 = WithColor::error(*(WithColor **)LineTableOffset,
                                               (raw_ostream *)0xe67796,(StringRef)ZEXT816(0),
                                               (bool)in_R8B);
                    Str_01.Length = 0x17;
                    Str_01.Data = "two compile unit DIEs, ";
                    prVar10 = raw_ostream::operator<<(prVar10,Str_01);
                    this_02 = &(pmVar15->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
                    local_98.value.Value.data = (uint8_t *)DWARFDie::getOffset((DWARFDie *)this_02);
                    local_98.value.Value.field_0 =
                         (anon_union_8_3_82d75f4a_for_ValueType_0)((long)"String: 0x%08lx" + 8);
                    local_98._0_8_ = Die.Die;
                    prVar10 = raw_ostream::operator<<(prVar10,(format_object_base *)&local_98.value)
                    ;
                    Str_02.Length = 5;
                    Str_02.Data = " and ";
                    prVar10 = raw_ostream::operator<<(prVar10,Str_02);
                    if ((auStack_60 == (undefined1  [8])0x0) || (Die.U == (DWARFUnit *)0x0)) {
                      __assert_fail("isValid() && \"must check validity prior to calling\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                                    ,0x43,"uint64_t llvm::DWARFDie::getOffset() const");
                    }
                    StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Die.Die
                    ;
                    prVar10 = raw_ostream::operator<<
                                        (prVar10,(format_object_base *)
                                                 &StmtListToDie._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count);
                    Str_03.Length = 0x30;
                    Str_03.Data = ", have the same DW_AT_stmt_list section offset:\n";
                    raw_ostream::operator<<(prVar10,Str_03);
                    DWARFDie::dump((DWARFDie *)this_02,*(raw_ostream **)LineTableOffset,0,*pDVar6);
                    pDVar12 = pDVar6;
                    DWARFDie::dump((DWARFDie *)auStack_60,*(raw_ostream **)LineTableOffset,0,*pDVar6
                                  );
                    prVar10 = *(raw_ostream **)LineTableOffset;
                    pcVar11 = prVar10->OutBufCur;
                    if (pcVar11 < prVar10->OutBufEnd) goto LAB_00d80634;
                    raw_ostream::write(prVar10,10,__buf_00,(size_t)pDVar12);
                    goto LAB_00d8042f;
                  }
                }
              }
              pmVar9 = std::
                       map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                       ::operator[]((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                                     *)local_e0,&local_40.value);
              pmVar9->U = (DWARFUnit *)auStack_60;
              pmVar9->Die = (DWARFDebugInfoEntry *)Die.U;
            }
          }
          else if (pLVar7 != (LineTable *)0x0) {
            __assert_fail("LineTable == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                          ,0x2a7,"void llvm::DWARFVerifier::verifyDebugLineStmtOffsets()");
          }
        }
      }
LAB_00d8042f:
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar1);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
               *)local_e0);
  return;
}

Assistant:

void DWARFVerifier::verifyDebugLineStmtOffsets() {
  std::map<uint64_t, DWARFDie> StmtListToDie;
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    // Get the attribute value as a section offset. No need to produce an
    // error here if the encoding isn't correct because we validate this in
    // the .debug_info verifier.
    auto StmtSectionOffset = toSectionOffset(Die.find(DW_AT_stmt_list));
    if (!StmtSectionOffset)
      continue;
    const uint64_t LineTableOffset = *StmtSectionOffset;
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    if (LineTableOffset < DCtx.getDWARFObj().getLineSection().Data.size()) {
      if (!LineTable) {
        ++NumDebugLineErrors;
        error() << ".debug_line[" << format("0x%08" PRIx64, LineTableOffset)
                << "] was not able to be parsed for CU:\n";
        dump(Die) << '\n';
        continue;
      }
    } else {
      // Make sure we don't get a valid line table back if the offset is wrong.
      assert(LineTable == nullptr);
      // Skip this line table as it isn't valid. No need to create an error
      // here because we validate this in the .debug_info verifier.
      continue;
    }
    auto Iter = StmtListToDie.find(LineTableOffset);
    if (Iter != StmtListToDie.end()) {
      ++NumDebugLineErrors;
      error() << "two compile unit DIEs, "
              << format("0x%08" PRIx64, Iter->second.getOffset()) << " and "
              << format("0x%08" PRIx64, Die.getOffset())
              << ", have the same DW_AT_stmt_list section offset:\n";
      dump(Iter->second);
      dump(Die) << '\n';
      // Already verified this line table before, no need to do it again.
      continue;
    }
    StmtListToDie[LineTableOffset] = Die;
  }
}